

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  ReflectionSchema *this_00;
  uint *puVar1;
  byte bVar2;
  Message *pMVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  MessageLite *pMVar7;
  OneofDescriptor *pOVar8;
  undefined8 *puVar9;
  char *description;
  Descriptor *descriptor;
  Metadata MVar10;
  
  MVar10 = Message::GetMetadata(message);
  if (MVar10.reflection == this) {
    descriptor = this->descriptor_;
    if (field->containing_type_ == descriptor) {
      bVar2 = field->field_0x1;
      if (0xbf < bVar2) {
        description = "Field is repeated; the method requires a singular field.";
        goto LAB_0027a5e2;
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (descriptor,field,"ReleaseMessage",CPPTYPE_MESSAGE);
      }
      if ((bVar2 & 8) != 0) {
        if (factory == (MessageFactory *)0x0) {
          factory = this->message_factory_;
        }
        uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        pMVar7 = internal::ExtensionSet::UnsafeArenaReleaseMessage
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                            field,factory);
        return (Message *)pMVar7;
      }
      if ((bVar2 & 0x20) == 0) {
        this_00 = &this->schema_;
        bVar4 = internal::ReflectionSchema::InRealOneof(this_00,field);
        if (!bVar4) {
          if ((field->options_->field_0)._impl_.weak_ == true) goto LAB_0027a586;
          uVar5 = internal::ReflectionSchema::HasBitIndex(this_00,field);
          if (uVar5 != 0xffffffff) {
            if ((this->schema_).has_bits_offset_ == -1) goto LAB_0027a590;
            bVar2 = (byte)uVar5 & 0x1f;
            uVar6 = internal::ReflectionSchema::HasBitsOffset(this_00);
            puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                             (ulong)(uVar5 >> 5) * 4 + (ulong)uVar6);
            *puVar1 = *puVar1 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
          }
        }
        bVar4 = internal::ReflectionSchema::InRealOneof(this_00,field);
        if (!bVar4) {
LAB_0027a552:
          puVar9 = (undefined8 *)MutableRawImpl(this,message,field);
          pMVar3 = (Message *)*puVar9;
          *puVar9 = 0;
          return pMVar3;
        }
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar8 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar8 = (field->scope_).containing_oneof;
          if (pOVar8 == (OneofDescriptor *)0x0) goto LAB_0027a5fe;
        }
        uVar5 = GetOneofCase(this,message,pOVar8);
        if (uVar5 != field->number_) {
          return (Message *)0x0;
        }
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar8 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar8 = (field->scope_).containing_oneof;
          if (pOVar8 == (OneofDescriptor *)0x0) {
LAB_0027a5fe:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xa9a);
          }
        }
        if ((pOVar8->field_count_ != 1) || ((pOVar8->fields_->field_0x1 & 2) == 0)) {
          *(undefined4 *)
           ((long)&(message->super_MessageLite)._vptr_MessageLite +
           (ulong)(uint)((int)((ulong)((long)pOVar8 - (long)pOVar8->containing_type_->oneof_decls_)
                              >> 3) * -0x24924924 + (this->schema_).oneof_case_offset_)) = 0;
          goto LAB_0027a552;
        }
      }
      else {
        UnsafeArenaReleaseMessage();
LAB_0027a586:
        UnsafeArenaReleaseMessage();
LAB_0027a590:
        UnsafeArenaReleaseMessage();
      }
      UnsafeArenaReleaseMessage();
      goto LAB_0027a5a4;
    }
  }
  else {
LAB_0027a5a4:
    descriptor = this->descriptor_;
    MVar10 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (descriptor,MVar10.descriptor,field,"ReleaseMessage");
  }
  description = "Field does not match message type.";
LAB_0027a5e2:
  anon_unknown_6::ReportReflectionUsageError(descriptor,field,"ReleaseMessage",description);
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || schema_.InRealOneof(field))) {
      ClearHasBit(message, field);
    }
    if (schema_.InRealOneof(field)) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}